

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::SpaceUsedExcludingSelfLong(Extension *this)

{
  int iVar1;
  Rep *pRVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  Rep *pRVar7;
  long lVar8;
  
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type * 4);
  if (this->is_repeated != true) {
    if (iVar1 == 10) {
      pRVar3 = (this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) != 0) {
        sVar4 = (**(code **)((pRVar3->super_RepeatedPtrFieldBase).arena_ + 0x58))(pRVar3);
        return sVar4;
      }
      if ((pRVar3 != (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x0) &&
         (lVar5 = __dynamic_cast(pRVar3,&MessageLite::typeinfo,&Message::typeinfo,0), lVar5 == 0)) {
        __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/casts.h"
                      ,0x5b,
                      "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::Message *, From = google::protobuf::MessageLite]"
                     );
      }
      sVar4 = (**(code **)((pRVar3->super_RepeatedPtrFieldBase).arena_ + 0xa0))(pRVar3);
      return sVar4;
    }
    if (iVar1 == 9) {
      sVar4 = StringSpaceUsedExcludingSelfLong((this->field_0).string_value);
      return sVar4 + 0x20;
    }
LAB_005bcf76:
    return 0;
  }
  switch(iVar1) {
  case 1:
  case 3:
  case 6:
  case 8:
    pRVar2 = ((this->field_0).repeated_int32_value)->rep_;
    lVar5 = (long)((this->field_0).repeated_int32_value)->total_size_ * 4;
    goto LAB_005bceb9;
  case 2:
  case 4:
  case 5:
    pRVar2 = ((this->field_0).repeated_int32_value)->rep_;
    lVar5 = (long)((this->field_0).repeated_int32_value)->total_size_ * 8;
LAB_005bceb9:
    sVar4 = 0x10;
    if (pRVar2 != (Rep *)0x0) {
      sVar4 = lVar5 + 0x18;
    }
    return sVar4;
  case 7:
    if (((this->field_0).repeated_int32_value)->rep_ == (Rep *)0x0) {
      return 0x10;
    }
    return (long)((this->field_0).repeated_int32_value)->total_size_ + 0x18;
  case 9:
    pRVar3 = (this->field_0).repeated_string_value;
    lVar5 = (long)(pRVar3->super_RepeatedPtrFieldBase).total_size_ << 3;
    pRVar7 = (pRVar3->super_RepeatedPtrFieldBase).rep_;
    if (pRVar7 == (Rep *)0x0) goto LAB_005bcf72;
    if (0 < pRVar7->allocated_size) {
      lVar8 = 0;
      do {
        sVar4 = StringSpaceUsedExcludingSelfLong((string *)pRVar7->elements[lVar8]);
        lVar5 = lVar5 + sVar4 + 0x20;
        lVar8 = lVar8 + 1;
        pRVar7 = (pRVar3->super_RepeatedPtrFieldBase).rep_;
      } while (lVar8 < pRVar7->allocated_size);
    }
    break;
  case 10:
    pRVar3 = (this->field_0).repeated_string_value;
    lVar5 = (long)(pRVar3->super_RepeatedPtrFieldBase).total_size_ << 3;
    pRVar7 = (pRVar3->super_RepeatedPtrFieldBase).rep_;
    if (pRVar7 == (Rep *)0x0) goto LAB_005bcf72;
    if (0 < pRVar7->allocated_size) {
      lVar8 = 0;
      do {
        lVar6 = (**(code **)(*pRVar7->elements[lVar8] + 0xa0))();
        lVar5 = lVar5 + lVar6;
        lVar8 = lVar8 + 1;
        pRVar7 = (pRVar3->super_RepeatedPtrFieldBase).rep_;
      } while (lVar8 < pRVar7->allocated_size);
    }
    break;
  default:
    goto LAB_005bcf76;
  }
  lVar5 = lVar5 + 8;
LAB_005bcf72:
  return lVar5 + 0x18;
}

Assistant:

size_t ExtensionSet::Extension::SpaceUsedExcludingSelfLong() const {
  size_t total_size = 0;
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                                  \
    total_size += sizeof(*repeated_##LOWERCASE##_value) +                     \
                  repeated_##LOWERCASE##_value->SpaceUsedExcludingSelfLong(); \
    break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_MESSAGE:
        // repeated_message_value is actually a RepeatedPtrField<MessageLite>,
        // but MessageLite has no SpaceUsedLong(), so we must directly call
        // RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() with a different
        // type handler.
        total_size +=
            sizeof(*repeated_message_value) +
            RepeatedMessage_SpaceUsedExcludingSelfLong(repeated_message_value);
        break;
    }
  } else {
    switch (cpp_type(type)) {
      case FieldDescriptor::CPPTYPE_STRING:
        total_size += sizeof(*string_value) +
                      StringSpaceUsedExcludingSelfLong(*string_value);
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (is_lazy) {
          total_size += lazymessage_value->SpaceUsedLong();
        } else {
          total_size += down_cast<Message*>(message_value)->SpaceUsedLong();
        }
        break;
      default:
        // No extra storage costs for primitive types.
        break;
    }
  }
  return total_size;
}